

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

fio_meta_ary_s * fio_postoffice_meta_copy_new(void)

{
  size_t sVar1;
  fio_meta_ary_s *in_RDI;
  size_t len;
  fio_lock_i ret;
  timespec local_28;
  
  in_RDI->capa = 0;
  in_RDI->arry = (fio_msg_metadata_fn *)0x0;
  in_RDI->start = 0;
  in_RDI->end = 0;
  if (fio_postoffice.meta.ary.end != fio_postoffice.meta.ary.start) {
    LOCK();
    UNLOCK();
    local_28.tv_sec = CONCAT71(local_28.tv_sec._1_7_,fio_postoffice.meta.lock);
    while (fio_postoffice.meta.lock != '\0') {
      fio_postoffice.meta.lock = '\x01';
      local_28.tv_sec = 0;
      local_28.tv_nsec = 1;
      nanosleep(&local_28,(timespec *)0x0);
      LOCK();
      UNLOCK();
      local_28.tv_sec = CONCAT71(local_28.tv_sec._1_7_,fio_postoffice.meta.lock);
    }
    fio_postoffice.meta.lock = '\x01';
    len = fio_postoffice.meta.ary.end - fio_postoffice.meta.ary.start;
    if (in_RDI != (fio_meta_ary_s *)0x0 && len != 0) {
      fio_meta_ary___require_on_top(in_RDI,len);
      sVar1 = in_RDI->end;
      memcpy(in_RDI->arry + sVar1,fio_postoffice.meta.ary.arry + fio_postoffice.meta.ary.start,
             len * 8);
      in_RDI->end = sVar1 + len;
    }
    LOCK();
    fio_postoffice.meta.lock = '\0';
    UNLOCK();
  }
  return in_RDI;
}

Assistant:

static fio_meta_ary_s fio_postoffice_meta_copy_new(void) {
  fio_meta_ary_s t = FIO_ARY_INIT;
  if (!fio_meta_ary_count(&fio_postoffice.meta.ary)) {
    return t;
  }
  fio_lock(&fio_postoffice.meta.lock);
  fio_meta_ary_concat(&t, &fio_postoffice.meta.ary);
  fio_unlock(&fio_postoffice.meta.lock);
  return t;
}